

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.cpp
# Opt level: O0

Var Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *this;
  ThreadContext *this_00;
  Var *values;
  undefined4 *puVar3;
  JavascriptLibrary *this_01;
  JavascriptGeneratorFunction *this_02;
  GeneratorVirtualScriptFunction *scriptFunction;
  RecyclableObject *prototype;
  JavascriptGenerator *generator_00;
  JavascriptPromise *pJVar4;
  JavascriptGenerator *generator;
  GeneratorVirtualScriptFunction *scriptFn;
  JavascriptAsyncFunction *asyncFn;
  JavascriptLibrary *library;
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  this = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetThreadContext(this);
  ThreadContext::ProbeStack(this_00,0xc00,this,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncFunction.cpp"
                                ,0x2d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&library,(CallInfo *)&function_local,values);
  this_01 = ScriptContext::GetLibrary(this);
  this_02 = &VarTo<Js::JavascriptAsyncFunction,Js::RecyclableObject>(function)->
             super_JavascriptGeneratorFunction;
  scriptFunction = JavascriptGeneratorFunction::GetGeneratorVirtualScriptFunction(this_02);
  prototype = JavascriptLibraryBase::GetNull(&this_01->super_JavascriptLibraryBase);
  generator_00 = JavascriptLibrary::CreateGenerator
                           (this_01,(Arguments *)&library,&scriptFunction->super_ScriptFunction,
                            prototype);
  pJVar4 = BeginAsyncFunctionExecution(generator_00);
  return pJVar4;
}

Assistant:

Var JavascriptAsyncFunction::EntryAsyncFunctionImplementation(
    RecyclableObject* function,
    CallInfo callInfo, ...)
{
    auto* scriptContext = function->GetScriptContext();
    PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);

    auto* library = scriptContext->GetLibrary();
    auto* asyncFn = VarTo<JavascriptAsyncFunction>(function);
    auto* scriptFn = asyncFn->GetGeneratorVirtualScriptFunction();
    auto* generator = library->CreateGenerator(args, scriptFn, library->GetNull());

    return BeginAsyncFunctionExecution(generator);
}